

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  sel_t *psVar4;
  long lVar5;
  idx_t count_00;
  char *pcVar6;
  idx_t i;
  ulong uVar7;
  data_ptr_t pdVar8;
  string_t new_value;
  string_t new_value_00;
  SelectionVector sel;
  LogicalType local_2260;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  Vector sort_key;
  UnifiedVectorFormat adata;
  Vector sliced_input;
  Vector extra_state;
  sel_t assign_sel [2048];
  
  UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  Vector::ToUnifiedFormat(inputs,count,&adata);
  UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  GenericArgMinMaxState<(duckdb::OrderType)3>::CreateExtraState(&extra_state,count);
  GenericArgMinMaxState<(duckdb::OrderType)3>::PrepareData(inputs + 1,count,&extra_state,&bdata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat(state_vector,count,&sdata);
  count_00 = 0;
  pcVar6 = (char *)0x0;
  for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = uVar7;
    if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(bdata.sel)->sel_vector[uVar7];
    }
    if ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
         (uVar3 & 0x3f) & 1) != 0)) {
      pdVar8 = bdata.data + uVar3 * 0x10;
      sort_key.vector_type = pdVar8[0];
      sort_key._1_1_ = pdVar8[1];
      sort_key._2_1_ = pdVar8[2];
      sort_key._3_1_ = pdVar8[3];
      sort_key._4_1_ = pdVar8[4];
      sort_key._5_1_ = pdVar8[5];
      sort_key._6_1_ = pdVar8[6];
      sort_key._7_1_ = pdVar8[7];
      sort_key.type.id_ = pdVar8[8];
      sort_key.type.physical_type_ = pdVar8[9];
      sort_key.type._2_1_ = pdVar8[10];
      sort_key.type._3_1_ = pdVar8[0xb];
      sort_key.type._4_1_ = pdVar8[0xc];
      sort_key.type._5_1_ = pdVar8[0xd];
      sort_key.type._6_1_ = pdVar8[0xe];
      sort_key.type._7_1_ = pdVar8[0xf];
      uVar3 = uVar7;
      if ((adata.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(adata.sel)->sel_vector[uVar7];
      }
      if ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
           (uVar3 & 0x3f) & 1) != 0)) {
        psVar4 = (sdata.sel)->sel_vector;
        uVar3 = uVar7;
        if (psVar4 != (sel_t *)0x0) {
          uVar3 = (ulong)psVar4[uVar7];
        }
        pcVar1 = *(char **)(sdata.data + uVar3 * 8);
        if ((*pcVar1 != '\x01') ||
           (bVar2 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)(pcVar1 + 0x18),(string_t *)&sort_key), bVar2)) {
          new_value.value.pointer.ptr = (char *)psVar4;
          new_value.value._0_1_ = sort_key.type.id_;
          new_value.value._1_1_ = sort_key.type.physical_type_;
          new_value.value._2_6_ = sort_key.type._2_6_;
          ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                    ((ArgMinMaxStateBase *)(pcVar1 + 0x18),(string_t *)sort_key._0_8_,new_value);
          pcVar1[1] = '\0';
          lVar5 = count_00 - (pcVar1 == pcVar6);
          assign_sel[lVar5] = (sel_t)uVar7;
          count_00 = lVar5 + 1;
          *pcVar1 = '\x01';
          pcVar6 = pcVar1;
        }
      }
    }
  }
  if (count_00 != 0) {
    LogicalType::LogicalType(&local_2260,BLOB);
    Vector::Vector(&sort_key,&local_2260,0x800);
    LogicalType::~LogicalType(&local_2260);
    SelectionVector::SelectionVector(&sel,assign_sel);
    Vector::Vector(&sliced_input,inputs,&sel,count_00);
    CreateSortKeyHelpers::CreateSortKey(&sliced_input,count_00,(OrderModifiers)0x303,&sort_key);
    pdVar8 = sort_key.data + 8;
    for (uVar7 = 0; count_00 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = uVar7;
      if (sel.sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)sel.sel_vector[uVar7];
      }
      psVar4 = (sdata.sel)->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        uVar3 = (ulong)psVar4[uVar3];
      }
      new_value_00.value.pointer.ptr = (char *)psVar4;
      new_value_00.value._0_8_ = *(undefined8 *)pdVar8;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(sdata.data + uVar3 * 8) + 8),
                 *(string_t **)(pdVar8 + -8),new_value_00);
      pdVar8 = pdVar8 + 0x10;
    }
    Vector::~Vector(&sliced_input);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&sort_key);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  Vector::~Vector(&extra_state);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}